

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O3

void trace_flushroot(jit_State *J,GCtrace *T)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  TraceNo1 *pTVar4;
  uint *puVar5;
  ulong uVar6;
  
  uVar3 = (ulong)(T->startpt).gcptr32;
  uVar2 = T->startins;
  if ((char)uVar2 != 'T') {
    puVar5 = (uint *)(ulong)(T->startpc).ptr32;
    switch(*puVar5 & 0xff) {
    case 0x4d:
      *puVar5 = uVar2;
      *(undefined1 *)(puVar5 + ((ulong)*(ushort *)((long)&T->startins + 2) - 0x8000)) = 0x49;
      break;
    case 0x50:
    case 0x53:
    case 0x57:
      *puVar5 = uVar2;
      break;
    case 0x54:
      uVar6 = (ulong)(*puVar5 >> 0x10);
      if ((char)puVar5[uVar6 - 0x7ffe] == 'P') {
        puVar5[uVar6 - 0x7ffe] = uVar2;
      }
    }
  }
  uVar1 = *(ushort *)(uVar3 + 0x26);
  if (uVar1 == T->traceno) {
    pTVar4 = (TraceNo1 *)(uVar3 + 0x26);
LAB_001166a4:
    *pTVar4 = T->nextroot;
  }
  else if ((ulong)uVar1 != 0) {
    uVar3 = (ulong)J->trace[uVar1].gcptr32;
    if (uVar3 != 0) {
      while (uVar1 = *(ushort *)(uVar3 + 0x56), uVar1 != 0) {
        if (uVar1 == T->traceno) {
          pTVar4 = (TraceNo1 *)(uVar3 + 0x56);
          goto LAB_001166a4;
        }
        uVar3 = (ulong)J->trace[uVar1].gcptr32;
      }
    }
  }
  return;
}

Assistant:

static void trace_flushroot(jit_State *J, GCtrace *T)
{
  GCproto *pt = &gcref(T->startpt)->pt;
  lua_assert(T->root == 0 && pt != NULL);
  /* First unpatch any modified bytecode. */
  trace_unpatch(J, T);
  /* Unlink root trace from chain anchored in prototype. */
  if (pt->trace == T->traceno) {  /* Trace is first in chain. Easy. */
    pt->trace = T->nextroot;
  } else if (pt->trace) {  /* Otherwise search in chain of root traces. */
    GCtrace *T2 = traceref(J, pt->trace);
    if (T2) {
      for (; T2->nextroot; T2 = traceref(J, T2->nextroot))
	if (T2->nextroot == T->traceno) {
	  T2->nextroot = T->nextroot;  /* Unlink from chain. */
	  break;
	}
    }
  }
}